

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

void on_event_send_complete_messenger_callback
               (IOTHUB_MESSAGE_LIST *iothub_message,
               TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT ev_send_comp_result,void *context)

{
  D2C_EVENT_SEND_RESULT DVar1;
  LOGGER_LOG p_Var2;
  D2C_EVENT_SEND_RESULT device_send_result;
  LOGGER_LOG l;
  DEVICE_SEND_EVENT_TASK *send_task;
  void *context_local;
  TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT ev_send_comp_result_local;
  IOTHUB_MESSAGE_LIST *iothub_message_local;
  
  if ((iothub_message == (IOTHUB_MESSAGE_LIST *)0x0) || (context == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"on_event_send_complete_messenger_callback",0xb0,1,
                "on_event_send_complete_messenger_callback was invoked, but either iothub_message (%p) or context (%p) are NULL"
                ,iothub_message,context);
    }
  }
  else {
    DVar1 = get_d2c_event_send_result_from(ev_send_comp_result);
    if (*context != 0) {
      (**context)(iothub_message,DVar1,*(undefined8 *)((long)context + 8));
    }
  }
  if (context != (void *)0x0) {
    free(context);
  }
  return;
}

Assistant:

static void on_event_send_complete_messenger_callback(IOTHUB_MESSAGE_LIST* iothub_message, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT ev_send_comp_result, void* context)
{
    DEVICE_SEND_EVENT_TASK* send_task = (DEVICE_SEND_EVENT_TASK*)context;
    if (iothub_message == NULL || send_task == NULL)
    {
        LogError("on_event_send_complete_messenger_callback was invoked, but either iothub_message (%p) or context (%p) are NULL", iothub_message, send_task);
    }
    else
    {
        D2C_EVENT_SEND_RESULT device_send_result = get_d2c_event_send_result_from(ev_send_comp_result);

        if (send_task->on_event_send_complete_callback != NULL)
        {
            send_task->on_event_send_complete_callback(iothub_message, device_send_result, send_task->on_event_send_complete_context);
        }
    }

    if (send_task)
    {
        free(send_task);
    }
}